

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O2

duckdb_state duckdb_set_config(duckdb_config config,char *name,char *option)

{
  allocator local_79;
  string local_78;
  Value local_58;
  
  if (option != (char *)0x0 && (name != (char *)0x0 && config != (duckdb_config)0x0)) {
    std::__cxx11::string::string((string *)&local_78,name,&local_79);
    duckdb::Value::Value(&local_58,option);
    duckdb::DBConfig::SetOptionByName((DBConfig *)config,&local_78,&local_58);
    duckdb::Value::~Value(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return (uint)(option == (char *)0x0 || (name == (char *)0x0 || config == (duckdb_config)0x0));
}

Assistant:

duckdb_state duckdb_set_config(duckdb_config config, const char *name, const char *option) {
	if (!config || !name || !option) {
		return DuckDBError;
	}

	try {
		auto db_config = (DBConfig *)config;
		db_config->SetOptionByName(name, Value(option));
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}